

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O0

int __thiscall Fl_Type::msgnum(Fl_Type *this)

{
  int iVar1;
  char *pcVar2;
  Fl_Widget_Type *local_20;
  Fl_Type *p;
  int count;
  Fl_Type *this_local;
  
  p._4_4_ = 0;
  local_20 = (Fl_Widget_Type *)this;
  while (local_20 != (Fl_Widget_Type *)0x0) {
    pcVar2 = label(&local_20->super_Fl_Type);
    if (pcVar2 != (char *)0x0) {
      p._4_4_ = p._4_4_ + 1;
    }
    if (((local_20 != (Fl_Widget_Type *)this) &&
        (iVar1 = (*(local_20->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar1 != 0)) &&
       (pcVar2 = Fl_Widget_Type::tooltip(local_20), pcVar2 != (char *)0x0)) {
      p._4_4_ = p._4_4_ + 1;
    }
    if ((local_20->super_Fl_Type).prev == (Fl_Type *)0x0) {
      local_20 = (Fl_Widget_Type *)(local_20->super_Fl_Type).parent;
    }
    else {
      local_20 = (Fl_Widget_Type *)(local_20->super_Fl_Type).prev;
    }
  }
  return p._4_4_;
}

Assistant:

int
Fl_Type::msgnum() {
  int		count;
  Fl_Type	*p;

  for (count = 0, p = this; p;) {
    if (p->label()) count ++;
    if (p != this && p->is_widget() && ((Fl_Widget_Type *)p)->tooltip()) count ++;

    if (p->prev) p = p->prev;
    else p = p->parent;
  }

  return count;
}